

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dup.cc
# Opt level: O0

void * ASN1_item_dup(ASN1_ITEM *it,void *x)

{
  int iVar1;
  ASN1_ITEM *pAVar2;
  void *ret;
  long i;
  uchar *p;
  uchar *b;
  void *x_local;
  ASN1_ITEM *it_local;
  
  p = (uchar *)0x0;
  if (x == (void *)0x0) {
    it_local = (ASN1_ITEM *)0x0;
  }
  else {
    b = (uchar *)x;
    x_local = it;
    iVar1 = ASN1_item_i2d((ASN1_VALUE *)x,&p,it);
    if (p == (uchar *)0x0) {
      it_local = (ASN1_ITEM *)0x0;
    }
    else {
      i = (long)p;
      pAVar2 = (ASN1_ITEM *)
               ASN1_item_d2i((ASN1_VALUE **)0x0,(uchar **)&i,(long)iVar1,(ASN1_ITEM *)x_local);
      OPENSSL_free(p);
      it_local = pAVar2;
    }
  }
  return it_local;
}

Assistant:

void *ASN1_item_dup(const ASN1_ITEM *it, void *x) {
  unsigned char *b = NULL;
  const unsigned char *p;
  long i;
  void *ret;

  if (x == NULL) {
    return NULL;
  }

  i = ASN1_item_i2d(reinterpret_cast<ASN1_VALUE *>(x), &b, it);
  if (b == NULL) {
    return NULL;
  }
  p = b;
  ret = ASN1_item_d2i(NULL, &p, i, it);
  OPENSSL_free(b);
  return ret;
}